

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall level_tools::paint_automatic(level_tools *this,xr_surface *surface,uint16_t flags)

{
  char *pcVar1;
  char cVar2;
  char *lname;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  lname = (surface->m_gamemtl)._M_dataplus._M_p;
  bVar3 = xray_re::xr_ini_file::line_exist(this->m_ini,"collider_presets",lname);
  if (!bVar3) {
    xray_re::msg("no invisible collider preset for game material %s");
    std::__cxx11::string::_M_replace
              ((ulong)&surface->m_texture,0,(char *)(surface->m_texture)._M_string_length,0x1e8b3b);
    std::__cxx11::string::_M_replace
              ((ulong)&surface->m_eshader,0,(char *)(surface->m_eshader)._M_string_length,0x1e9856);
    return;
  }
  pcVar5 = xray_re::xr_ini_file::r_string(this->m_ini,"collider_presets",lname);
  cVar2 = *pcVar5;
  pcVar6 = pcVar5;
  while ((cVar2 != '\0' &&
         (((iVar4 = isalnum((int)cVar2), iVar4 != 0 || (cVar2 == '_')) || (cVar2 == '\\'))))) {
    pcVar1 = pcVar6 + 1;
    pcVar6 = pcVar6 + 1;
    cVar2 = *pcVar1;
  }
  if (pcVar6 != pcVar5) {
    std::__cxx11::string::_M_replace
              ((ulong)&surface->m_texture,0,(char *)(surface->m_texture)._M_string_length,
               (ulong)pcVar5);
    for (pcVar6 = pcVar6 + 2; (cVar2 = pcVar6[-2], cVar2 == '\t' || (cVar2 == ' '));
        pcVar6 = pcVar6 + 1) {
    }
    if (cVar2 == ',') {
      for (; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
      }
    }
    else {
      pcVar6 = (char *)0x0;
    }
    if (pcVar6 != (char *)0x0) {
      cVar2 = *pcVar6;
      pcVar5 = pcVar6;
      while ((cVar2 != '\0' &&
             (((iVar4 = isalnum((int)cVar2), iVar4 != 0 || (cVar2 == '_')) || (cVar2 == '\\'))))) {
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        cVar2 = *pcVar1;
      }
      if (pcVar5 != pcVar6) {
        std::__cxx11::string::_M_replace
                  ((ulong)&surface->m_eshader,0,(char *)(surface->m_eshader)._M_string_length,
                   (ulong)pcVar6);
        for (pcVar5 = pcVar5 + 2; (cVar2 = pcVar5[-2], cVar2 == '\t' || (cVar2 == ' '));
            pcVar5 = pcVar5 + 1) {
        }
        if (cVar2 == ',') {
          for (; (*pcVar5 == ' ' || (*pcVar5 == '\t')); pcVar5 = pcVar5 + 1) {
          }
        }
        else {
          pcVar5 = (char *)0x0;
        }
        if (pcVar5 != (char *)0x0) {
          cVar2 = *pcVar5;
          pcVar6 = pcVar5;
          while ((cVar2 != '\0' &&
                 (((iVar4 = isalnum((int)cVar2), iVar4 != 0 || (cVar2 == '_')) || (cVar2 == '\\'))))
                ) {
            pcVar1 = pcVar6 + 1;
            pcVar6 = pcVar6 + 1;
            cVar2 = *pcVar1;
          }
          if (pcVar6 != pcVar5) {
            std::__cxx11::string::_M_replace
                      ((ulong)&surface->m_cshader,0,(char *)(surface->m_cshader)._M_string_length,
                       (ulong)pcVar5);
            xray_re::msg("%s -> %s, %s, %s",lname,(surface->m_texture)._M_dataplus._M_p,
                         (surface->m_eshader)._M_dataplus._M_p,(surface->m_cshader)._M_dataplus._M_p
                        );
            return;
          }
        }
      }
    }
    return;
  }
  __assert_fail("p != preset",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_tools_visuals.cxx"
                ,0x399,"void level_tools::paint_automatic(xr_surface *, uint16_t) const");
}

Assistant:

void level_tools::paint_automatic(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("collider_presets", gamemtl)) {
		const char* preset = m_ini->r_string("collider_presets", gamemtl);

		const char* p = scan_value(preset);
		xr_assert(p != preset);
		surface->texture().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->eshader().assign(preset, p - preset);

		if ((p = skip_comma(p)) == 0)
			return;
		if ((p = scan_value(preset = p)) == preset)
			return;
		surface->cshader().assign(preset, p - preset);

		msg("%s -> %s, %s, %s", gamemtl,
				surface->texture().c_str(), surface->eshader().c_str(),
				surface->cshader().c_str());
	} else {
		msg("no invisible collider preset for game material %s", gamemtl);
		surface->texture() = "prop\\prop_fake_kollision";
		surface->eshader() = "def_shaders\\def_vertex";
	}
}